

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message.cc
# Opt level: O2

Message * __thiscall
google::protobuf::DynamicMessageFactory::GetPrototypeNoLock
          (DynamicMessageFactory *this,Descriptor *type)

{
  undefined4 uVar1;
  undefined4 uVar2;
  byte bVar3;
  mapped_type pTVar4;
  bool bVar5;
  CppType CVar6;
  DescriptorPool *pDVar7;
  mapped_type *ppTVar8;
  pointer __p;
  pointer __p_00;
  MessageFactory *pMVar9;
  undefined4 extraout_var;
  LogMessage *other;
  char *pcVar10;
  DynamicMessage *this_00;
  Reflection *this_01;
  int j;
  DescriptorPool *pDVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  ulong extraout_RDX;
  int iVar15;
  Descriptor *pDVar16;
  uint uVar17;
  unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_> *puVar18;
  long lVar19;
  int iVar20;
  int iVar21;
  char *__s;
  int i;
  long lVar22;
  FieldDescriptor *pFVar23;
  int i_2;
  ulong uVar24;
  LogFinisher local_99;
  mapped_type local_98;
  Descriptor *type_local;
  ulong local_88;
  unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_> *local_80;
  DynamicMessageFactory *local_78;
  undefined1 local_70 [56];
  int local_38;
  
  type_local = type;
  if ((this->delegate_to_generated_factory_ == true) &&
     (pDVar11 = *(DescriptorPool **)(*(long *)(type + 0x10) + 0x10),
     pDVar7 = DescriptorPool::generated_pool(), pDVar11 == pDVar7)) {
    pMVar9 = MessageFactory::generated_factory();
    iVar20 = (*pMVar9->_vptr_MessageFactory[2])(pMVar9,type);
    return (Message *)CONCAT44(extraout_var,iVar20);
  }
  ppTVar8 = std::__detail::
            _Map_base<const_google::protobuf::Descriptor_*,_std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessageFactory::TypeInfo_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessageFactory::TypeInfo_*>_>,_std::__detail::_Select1st,_std::equal_to<const_google::protobuf::Descriptor_*>,_std::hash<const_google::protobuf::Descriptor_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<const_google::protobuf::Descriptor_*,_std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessageFactory::TypeInfo_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessageFactory::TypeInfo_*>_>,_std::__detail::_Select1st,_std::equal_to<const_google::protobuf::Descriptor_*>,_std::hash<const_google::protobuf::Descriptor_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&this->prototypes_,&type_local);
  if (*ppTVar8 == (mapped_type)0x0) {
    local_98 = (mapped_type)operator_new(0x50);
    local_98->offsets =
         (__uniq_ptr_data<unsigned_int,_std::default_delete<unsigned_int[]>,_true,_true>)0x0;
    local_98->has_bits_indices =
         (__uniq_ptr_data<unsigned_int,_std::default_delete<unsigned_int[]>,_true,_true>)0x0;
    local_98->reflection =
         (__uniq_ptr_data<const_google::protobuf::Reflection,_std::default_delete<const_google::protobuf::Reflection>,_true,_true>
          )0x0;
    local_98->prototype = (DynamicMessage *)0x0;
    *ppTVar8 = local_98;
    local_98->type = type_local;
    pDVar11 = this->pool_;
    if (pDVar11 == (DescriptorPool *)0x0) {
      pDVar11 = *(DescriptorPool **)(*(long *)(type_local + 0x10) + 0x10);
    }
    local_98->pool = pDVar11;
    local_98->factory = this;
    uVar12 = 0;
    uVar24 = (ulong)*(uint *)(type_local + 0x68);
    if ((int)*(uint *)(type_local + 0x68) < 1) {
      uVar24 = uVar12;
    }
    local_88 = 0;
    for (; uVar24 * 0x28 - uVar12 != 0; uVar12 = uVar12 + 0x28) {
      uVar17 = 1;
      if (*(int *)(*(long *)(type_local + 0x30) + 4 + uVar12) == 1) {
        uVar17 = (uint)((*(byte *)(*(long *)(*(long *)(type_local + 0x30) + 0x20 + uVar12) + 1) & 2)
                       == 0);
      }
      local_88 = (ulong)((int)local_88 + uVar17);
    }
    lVar13 = (long)(int)local_88 + (long)*(int *)(type_local + 4);
    uVar24 = lVar13 * 4;
    if ((int)lVar13 < 0) {
      uVar24 = 0xffffffffffffffff;
    }
    local_78 = this;
    __p = (pointer)operator_new__(uVar24);
    std::__uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>::reset
              ((__uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_> *)
               &local_98->offsets,__p);
    local_98->has_bits_offset = -1;
    local_80 = &local_98->has_bits_indices;
    uVar17 = 0;
    for (lVar13 = 0; uVar24 = (ulong)*(int *)(type_local + 4), lVar13 < (long)uVar24;
        lVar13 = lVar13 + 1) {
      pFVar23 = (FieldDescriptor *)(lVar13 * 0x48 + *(long *)(type_local + 0x28));
      bVar5 = FieldDescriptor::has_optional_keyword(pFVar23);
      pDVar16 = type_local;
      if (((bVar5) || (((byte)pFVar23[1] & 0x60) == 0x40)) &&
         (*(char *)(*(long *)(pFVar23 + 0x38) + 0x4f) == '\0')) {
        if (local_98->has_bits_offset == -1) {
          local_98->has_bits_offset = 0x20;
          uVar24 = (long)*(int *)(type_local + 4) * 4;
          if ((long)*(int *)(type_local + 4) < 0) {
            uVar24 = 0xffffffffffffffff;
          }
          __p_00 = (pointer)operator_new__(uVar24);
          for (lVar14 = 0; lVar14 < *(int *)(pDVar16 + 4); lVar14 = lVar14 + 1) {
            __p_00[lVar14] = 0xffffffff;
          }
          std::__uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>::reset
                    ((__uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_> *)local_80
                     ,__p_00);
        }
        (local_80->_M_t).super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>.
        _M_t.super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
        super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl[lVar13] = uVar17;
        uVar17 = uVar17 + 1;
      }
    }
    if ((int)uVar17 < 1) {
      iVar20 = 0x20;
    }
    else {
      iVar20 = ((int)(uVar17 + 0x1f) / 0x20) * 4 + 0x27;
      iVar20 = iVar20 - iVar20 % 8;
    }
    if ((int)local_88 != 0) {
      local_98->oneof_case_offset = iVar20;
      iVar20 = iVar20 + (int)local_88 * 4 + 7;
      iVar20 = iVar20 - iVar20 % 8;
    }
    if (*(int *)(type_local + 0x78) < 1) {
      iVar21 = -1;
      iVar15 = iVar20;
    }
    else {
      iVar15 = (iVar20 + 0x1f) - (iVar20 + 0x1f) % 8;
      iVar21 = iVar20;
    }
    local_98->extensions_offset = iVar21;
    puVar18 = (unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_> *)0x0;
    uVar12 = 0;
    pDVar16 = type_local;
    while ((long)uVar12 < (long)(int)uVar24) {
      lVar13 = *(long *)(pDVar16 + 0x28);
      pFVar23 = (FieldDescriptor *)
                ((long)&(puVar18->_M_t).
                        super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>
                        .super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl + lVar13);
      local_88 = uVar12;
      bVar5 = anon_unknown_0::InRealOneof(pFVar23);
      local_80 = puVar18;
      if (!bVar5) {
        bVar3 = *(byte *)((long)&(puVar18->_M_t).
                                 super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>
                                 .super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl +
                         lVar13 + 1);
        CVar6 = FieldDescriptor::cpp_type(pFVar23);
        if ((~bVar3 & 0x60) == 0) {
          iVar20 = 0x10;
          iVar21 = 8;
          if (7 < CVar6 - CPPTYPE_INT32) {
            if (CVar6 == CPPTYPE_STRING) {
              iVar20 = 0x18;
            }
            else {
              if (CVar6 != CPPTYPE_MESSAGE) goto LAB_0038e1a7;
              bVar5 = FieldDescriptor::is_map(pFVar23);
              iVar20 = 0x18;
              if (bVar5) {
                iVar20 = 0x80;
              }
            }
            iVar21 = 8;
          }
        }
        else if (CVar6 - CPPTYPE_INT32 < 10) {
          iVar20 = *(int *)(&DAT_0042c6d4 + (ulong)(CVar6 - CPPTYPE_INT32) * 4);
          iVar21 = iVar20;
        }
        else {
LAB_0038e1a7:
          internal::LogMessage::LogMessage
                    ((LogMessage *)local_70,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/dynamic_message.cc"
                     ,0xcd);
          other = internal::LogMessage::operator<<((LogMessage *)local_70,"Can\'t get here.");
          internal::LogFinisher::operator=(&local_99,other);
          internal::LogMessage::~LogMessage((LogMessage *)local_70);
          iVar20 = 0;
          iVar21 = 0;
        }
        iVar15 = iVar15 + iVar21 + -1;
        uVar17 = iVar15 - iVar15 % iVar21;
        __p[local_88] = uVar17;
        iVar15 = uVar17 + iVar20;
        uVar24 = (ulong)*(uint *)(type_local + 4);
        pDVar16 = type_local;
      }
      puVar18 = local_80 + 9;
      uVar12 = local_88 + 1;
    }
    lVar13 = 0x20;
    for (__s = (char *)0x0; uVar24 = (ulong)*(int *)(pDVar16 + 0x68), (long)__s < (long)uVar24;
        __s = __s + 1) {
      if ((*(int *)(*(long *)(pDVar16 + 0x30) + -0x1c + lVar13) != 1) ||
         ((*(byte *)(*(long *)(*(long *)(pDVar16 + 0x30) + lVar13) + 1) & 2) == 0)) {
        uVar24 = (long)(iVar15 + 7) % 8;
        uVar12 = uVar24 & 0xffffffff;
        uVar17 = (iVar15 + 7) - (int)uVar24;
        __p[(long)(__s + *(int *)(pDVar16 + 4))] = uVar17;
        iVar15 = uVar17 + 8;
      }
      lVar13 = lVar13 + 0x28;
    }
    local_98->weak_field_map_offset = -1;
    local_98->size = iVar15;
    for (lVar13 = 0; lVar13 < (int)uVar24; lVar13 = lVar13 + 1) {
      lVar14 = lVar13 * 0x28;
      if ((*(int *)(*(long *)(pDVar16 + 0x30) + 4 + lVar14) != 1) ||
         ((*(byte *)(*(long *)(*(long *)(pDVar16 + 0x30) + lVar14 + 0x20) + 1) & 2) == 0)) {
        lVar19 = 0;
        for (lVar22 = 0; lVar22 < *(int *)(*(long *)(pDVar16 + 0x30) + 4 + lVar14);
            lVar22 = lVar22 + 1) {
          pcVar10 = FieldDescriptor::index
                              ((FieldDescriptor *)
                               (*(long *)(*(long *)(pDVar16 + 0x30) + lVar14 + 0x20) + lVar19),__s,
                               (int)uVar12);
          __p[(int)pcVar10] = 0x40000000;
          lVar19 = lVar19 + 0x48;
          uVar12 = extraout_RDX;
          pDVar16 = type_local;
        }
        uVar24 = (ulong)*(uint *)(pDVar16 + 0x68);
      }
    }
    this_00 = (DynamicMessage *)operator_new((long)iVar15);
    memset(this_00,0,(long)iVar15);
    pTVar4 = local_98;
    DynamicMessage::DynamicMessage(this_00,local_98,false);
    local_70._0_8_ = pTVar4->prototype;
    local_70._8_8_ =
         (pTVar4->offsets)._M_t.
         super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
         super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl;
    local_70._16_8_ =
         (pTVar4->has_bits_indices)._M_t.
         super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
         super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl;
    local_70._24_4_ = pTVar4->has_bits_offset;
    local_70._28_4_ = 8;
    uVar1 = pTVar4->oneof_case_offset;
    uVar2 = pTVar4->extensions_offset;
    local_70._32_8_ = CONCAT44(uVar1,uVar2);
    local_70._40_4_ = pTVar4->size;
    local_70._44_4_ = pTVar4->weak_field_map_offset;
    local_70._48_8_ = 0;
    local_38 = 0;
    this_01 = (Reflection *)operator_new(0x60);
    Reflection::Reflection
              (this_01,pTVar4->type,(ReflectionSchema *)local_70,pTVar4->pool,
               &local_78->super_MessageFactory);
    std::
    __uniq_ptr_impl<const_google::protobuf::Reflection,_std::default_delete<const_google::protobuf::Reflection>_>
    ::reset((__uniq_ptr_impl<const_google::protobuf::Reflection,_std::default_delete<const_google::protobuf::Reflection>_>
             *)&pTVar4->reflection,this_01);
    DynamicMessage::CrossLinkPrototypes(this_00);
  }
  else {
    this_00 = (*ppTVar8)->prototype;
  }
  return &this_00->super_Message;
}

Assistant:

const Message* DynamicMessageFactory::GetPrototypeNoLock(
    const Descriptor* type) {
  if (delegate_to_generated_factory_ &&
      type->file()->pool() == DescriptorPool::generated_pool()) {
    return MessageFactory::generated_factory()->GetPrototype(type);
  }

  const TypeInfo** target = &prototypes_[type];
  if (*target != nullptr) {
    // Already exists.
    return (*target)->prototype;
  }

  TypeInfo* type_info = new TypeInfo;
  *target = type_info;

  type_info->type = type;
  type_info->pool = (pool_ == nullptr) ? type->file()->pool() : pool_;
  type_info->factory = this;

  // We need to construct all the structures passed to Reflection's constructor.
  // This includes:
  // - A block of memory that contains space for all the message's fields.
  // - An array of integers indicating the byte offset of each field within
  //   this block.
  // - A big bitfield containing a bit for each field indicating whether
  //   or not that field is set.
  int real_oneof_count = 0;
  for (int i = 0; i < type->oneof_decl_count(); i++) {
    if (!type->oneof_decl(i)->is_synthetic()) {
      real_oneof_count++;
    }
  }

  // Compute size and offsets.
  uint32_t* offsets = new uint32_t[type->field_count() + real_oneof_count];
  type_info->offsets.reset(offsets);

  // Decide all field offsets by packing in order.
  // We place the DynamicMessage object itself at the beginning of the allocated
  // space.
  int size = sizeof(DynamicMessage);
  size = AlignOffset(size);

  // Next the has_bits, which is an array of uint32s.
  type_info->has_bits_offset = -1;
  int max_hasbit = 0;
  for (int i = 0; i < type->field_count(); i++) {
    if (HasHasbit(type->field(i))) {
      if (type_info->has_bits_offset == -1) {
        // At least one field in the message requires a hasbit, so allocate
        // hasbits.
        type_info->has_bits_offset = size;
        uint32_t* has_bits_indices = new uint32_t[type->field_count()];
        for (int j = 0; j < type->field_count(); j++) {
          // Initialize to -1, fields that need a hasbit will overwrite.
          has_bits_indices[j] = static_cast<uint32_t>(-1);
        }
        type_info->has_bits_indices.reset(has_bits_indices);
      }
      type_info->has_bits_indices[i] = max_hasbit++;
    }
  }

  if (max_hasbit > 0) {
    int has_bits_array_size = DivideRoundingUp(max_hasbit, bitsizeof(uint32_t));
    size += has_bits_array_size * sizeof(uint32_t);
    size = AlignOffset(size);
  }

  // The oneof_case, if any. It is an array of uint32s.
  if (real_oneof_count > 0) {
    type_info->oneof_case_offset = size;
    size += real_oneof_count * sizeof(uint32_t);
    size = AlignOffset(size);
  }

  // The ExtensionSet, if any.
  if (type->extension_range_count() > 0) {
    type_info->extensions_offset = size;
    size += sizeof(ExtensionSet);
    size = AlignOffset(size);
  } else {
    // No extensions.
    type_info->extensions_offset = -1;
  }

  // All the fields.
  //
  // TODO(b/31226269):  Optimize the order of fields to minimize padding.
  for (int i = 0; i < type->field_count(); i++) {
    // Make sure field is aligned to avoid bus errors.
    // Oneof fields do not use any space.
    if (!InRealOneof(type->field(i))) {
      int field_size = FieldSpaceUsed(type->field(i));
      size = AlignTo(size, std::min(kSafeAlignment, field_size));
      offsets[i] = size;
      size += field_size;
    }
  }

  // The oneofs.
  for (int i = 0; i < type->oneof_decl_count(); i++) {
    if (!type->oneof_decl(i)->is_synthetic()) {
      size = AlignTo(size, kSafeAlignment);
      offsets[type->field_count() + i] = size;
      size += kMaxOneofUnionSize;
    }
  }

  type_info->weak_field_map_offset = -1;

  // Align the final size to make sure no clever allocators think that
  // alignment is not necessary.
  type_info->size = size;

  // Construct the reflection object.

  // Compute the size of default oneof instance and offsets of default
  // oneof fields.
  for (int i = 0; i < type->oneof_decl_count(); i++) {
    if (type->oneof_decl(i)->is_synthetic()) continue;
    for (int j = 0; j < type->oneof_decl(i)->field_count(); j++) {
      const FieldDescriptor* field = type->oneof_decl(i)->field(j);
      // oneof fields are not accessed through offsets, but we still have the
      // entry from a legacy implementation. This should be removed at some
      // point.
      // Mark the field to prevent unintentional access through reflection.
      // Don't use the top bit because that is for unused fields.
      offsets[field->index()] = internal::kInvalidFieldOffsetTag;
    }
  }

  // Allocate the prototype fields.
  void* base = operator new(size);
  memset(base, 0, size);

  // We have already locked the factory so we should not lock in the constructor
  // of dynamic message to avoid dead lock.
  DynamicMessage* prototype = new (base) DynamicMessage(type_info, false);

  internal::ReflectionSchema schema = {
      type_info->prototype,
      type_info->offsets.get(),
      type_info->has_bits_indices.get(),
      type_info->has_bits_offset,
      PROTOBUF_FIELD_OFFSET(DynamicMessage, _internal_metadata_),
      type_info->extensions_offset,
      type_info->oneof_case_offset,
      type_info->size,
      type_info->weak_field_map_offset,
      nullptr /* inlined_string_indices_ */,
      0 /* inlined_string_donated_offset_ */};

  type_info->reflection.reset(
      new Reflection(type_info->type, schema, type_info->pool, this));

  // Cross link prototypes.
  prototype->CrossLinkPrototypes();

  return prototype;
}